

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O1

bool __thiscall
InliningDecider::ContinueInliningUserDefinedFunctions
          (InliningDecider *this,uint32 bytecodeInlinedCount)

{
  uint uVar1;
  FunctionBody *pFVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  char16 *pcVar8;
  bool bVar9;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
  pFVar2 = this->topFunc;
  if ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_00564959;
    *puVar7 = 0;
  }
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015b0240,InlinePhase,uVar5,
                     ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
                     functionId);
  bVar9 = true;
  if ((!bVar4) && ((uint)(this->threshold).inlineCountMax < bytecodeInlinedCount)) {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    pFVar2 = this->topFunc;
    if ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) {
LAB_00564959:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015d3490,InlinePhase,uVar5,
                       ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
    if (bVar4) {
      uVar1 = (this->threshold).inlineCountMax;
      iVar6 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7]
              )();
      pcVar8 = Js::FunctionProxy::GetDebugNumberSet
                         ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_88);
      bVar9 = false;
      Output::Print(L"INLINING: Skip Inline: InlineCountMax threshold %d, reached: %s (#%s)\n",
                    (ulong)uVar1,CONCAT44(extraout_var,iVar6),pcVar8);
      Output::Flush();
    }
    else {
      bVar9 = false;
    }
  }
  return bVar9;
}

Assistant:

bool InliningDecider::ContinueInliningUserDefinedFunctions(uint32 bytecodeInlinedCount) const
{
#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    if (PHASE_FORCE(Js::InlinePhase, this->topFunc) || bytecodeInlinedCount <= (uint)this->threshold.inlineCountMax)
    {
        return true;
    }

    INLINE_TESTTRACE(_u("INLINING: Skip Inline: InlineCountMax threshold %d, reached: %s (#%s)\n"),
        (uint)this->threshold.inlineCountMax,
        this->topFunc->GetDisplayName(), this->topFunc->GetDebugNumberSet(debugStringBuffer));

    return false;
}